

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O1

Result * CoreML::validateCanModelBeUpdatable(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint32 uVar3;
  string err;
  Result r;
  string local_58;
  Result local_38;
  
  Result::Result(&local_38);
  uVar3 = format->_oneof_case_[0];
  if ((int)uVar3 < 0x193) {
    if ((uVar3 - 200 < 3) || (uVar3 == 0x12f)) {
LAB_0027a3f9:
      paVar2 = &local_38.m_message.field_2;
      __return_storage_ptr__->m_type = local_38.m_type;
      __return_storage_ptr__->m_reason = local_38.m_reason;
      paVar1 = &(__return_storage_ptr__->m_message).field_2;
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38.m_message._M_dataplus._M_p == paVar2) {
        paVar1->_M_allocated_capacity =
             CONCAT71(local_38.m_message.field_2._M_allocated_capacity._1_7_,
                      local_38.m_message.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) =
             local_38.m_message.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_38.m_message._M_dataplus._M_p;
        (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
             CONCAT71(local_38.m_message.field_2._M_allocated_capacity._1_7_,
                      local_38.m_message.field_2._M_local_buf[0]);
      }
      (__return_storage_ptr__->m_message)._M_string_length = local_38.m_message._M_string_length;
      local_38.m_message._M_string_length = 0;
      local_38.m_message.field_2._M_local_buf[0] = '\0';
      local_38.m_message._M_dataplus._M_p = (pointer)paVar2;
      goto LAB_0027a447;
    }
  }
  else if ((uVar3 - 0x193 < 2) || (uVar3 == 500)) goto LAB_0027a3f9;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_replace((ulong)&local_58,0,(char *)0x0,0x321920);
  Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_PARAMETERS,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
LAB_0027a447:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.m_message._M_dataplus._M_p != &local_38.m_message.field_2) {
    operator_delete(local_38.m_message._M_dataplus._M_p,
                    CONCAT71(local_38.m_message.field_2._M_allocated_capacity._1_7_,
                             local_38.m_message.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateCanModelBeUpdatable(const Specification::Model& format) {
        Result r;
        switch (format.Type_case()) {
            case Specification::Model::kNeuralNetwork:
            case Specification::Model::kNeuralNetworkRegressor:
            case Specification::Model::kNeuralNetworkClassifier:
            case Specification::Model::kKNearestNeighborsClassifier:
            case Specification::Model::kPipeline:
            case Specification::Model::kPipelineRegressor:
            case Specification::Model::kPipelineClassifier:
                return r;
            default: {
                std::string err;
                err = "This model type is not supported for on-device update.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_PARAMETERS, err);
            }
        }
    }